

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestSuite * __thiscall
testing::internal::UnitTestImpl::GetTestSuite
          (UnitTestImpl *this,char *test_suite_name,char *type_param,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc)

{
  bool bVar1;
  byte bVar2;
  reference ppTVar3;
  TestSuite *this_00;
  string *in_RSI;
  long in_RDI;
  vector<int,_std::allocator<int>_> *this_01;
  UnitTestFilter death_test_suite_filter;
  TestSuite *new_test_suite;
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
  test_suite;
  string *in_stack_fffffffffffffe28;
  UnitTestFilter *in_stack_fffffffffffffe30;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  allocator<char> *in_stack_fffffffffffffe50;
  UnitTestFilter *this_02;
  char *in_stack_fffffffffffffe58;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  TearDownTestSuiteFunc in_stack_fffffffffffffea0;
  TestSuiteNameIs *in_stack_fffffffffffffea8;
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
  *in_stack_fffffffffffffeb0;
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
  *in_stack_fffffffffffffeb8;
  TestSuite *in_stack_fffffffffffffec0;
  const_iterator in_stack_fffffffffffffec8;
  allocator<char> local_121;
  string local_120 [112];
  TestSuite *local_b0;
  string *in_stack_ffffffffffffff68;
  UnitTestFilter *in_stack_ffffffffffffff70;
  string local_88 [112];
  string *local_18;
  TestSuite *local_8;
  
  local_18 = in_RSI;
  std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::rbegin
            (in_stack_fffffffffffffe38);
  std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::rend
            (in_stack_fffffffffffffe38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  TestSuiteNameIs::TestSuiteNameIs
            ((TestSuiteNameIs *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite**,std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>>>,testing::internal::TestSuiteNameIs>
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  TestSuiteNameIs::~TestSuiteNameIs((TestSuiteNameIs *)0x1490ca);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::rend
            (in_stack_fffffffffffffe38);
  bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
                           *)in_stack_fffffffffffffe30,
                          (reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
                           *)in_stack_fffffffffffffe28);
  if (bVar1) {
    ppTVar3 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
                           *)in_stack_fffffffffffffe30);
    local_8 = *ppTVar3;
  }
  else {
    this_00 = (TestSuite *)operator_new(0x108);
    TestSuite::TestSuite
              (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8,
               (char *)in_stack_fffffffffffffeb0,(SetUpTestSuiteFunc)in_stack_fffffffffffffea8,
               in_stack_fffffffffffffea0);
    __s = &local_121;
    local_b0 = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (char *)__s,in_stack_fffffffffffffe50);
    anon_unknown_37::UnitTestFilter::UnitTestFilter
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator(&local_121);
    this_02 = (UnitTestFilter *)&stack0xfffffffffffffeb7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (char *)__s,(allocator<char> *)this_02);
    bVar2 = anon_unknown_37::UnitTestFilter::MatchesName(this_02,local_18);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeb7);
    if ((bVar2 & 1) == 0) {
      std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::push_back
                ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                 CONCAT17(bVar2,in_stack_fffffffffffffe40),(value_type *)in_stack_fffffffffffffe38);
    }
    else {
      *(int *)(in_RDI + 0x164) = *(int *)(in_RDI + 0x164) + 1;
      in_stack_fffffffffffffe30 = (UnitTestFilter *)(in_RDI + 0xb8);
      std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                 in_stack_fffffffffffffe28);
      __gnu_cxx::
      __normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
      ::operator+((__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                   *)in_stack_fffffffffffffe38,(difference_type)in_stack_fffffffffffffe30);
      __gnu_cxx::
      __normal_iterator<testing::TestSuite*const*,std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>>
      ::__normal_iterator<testing::TestSuite**>
                ((__normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                  *)in_stack_fffffffffffffe30,
                 (__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                  *)in_stack_fffffffffffffe28);
      std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::insert
                ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                 in_stack_fffffffffffffec0,in_stack_fffffffffffffec8,
                 (value_type *)in_stack_fffffffffffffeb8);
    }
    this_01 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0xd0);
    std::vector<int,_std::allocator<int>_>::size(this_01);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe30,
               (value_type_conflict1 *)this_01);
    local_8 = local_b0;
    anon_unknown_37::UnitTestFilter::~UnitTestFilter(in_stack_fffffffffffffe30);
  }
  return local_8;
}

Assistant:

TestSuite* UnitTestImpl::GetTestSuite(
    const char* test_suite_name, const char* type_param,
    internal::SetUpTestSuiteFunc set_up_tc,
    internal::TearDownTestSuiteFunc tear_down_tc) {
  // Can we find a TestSuite with the given name?
  const auto test_suite =
      std::find_if(test_suites_.rbegin(), test_suites_.rend(),
                   TestSuiteNameIs(test_suite_name));

  if (test_suite != test_suites_.rend()) return *test_suite;

  // No.  Let's create one.
  auto* const new_test_suite =
      new TestSuite(test_suite_name, type_param, set_up_tc, tear_down_tc);

  const UnitTestFilter death_test_suite_filter(kDeathTestSuiteFilter);
  // Is this a death test suite?
  if (death_test_suite_filter.MatchesName(test_suite_name)) {
    // Yes.  Inserts the test suite after the last death test suite
    // defined so far.  This only works when the test suites haven't
    // been shuffled.  Otherwise we may end up running a death test
    // after a non-death test.
    ++last_death_test_suite_;
    test_suites_.insert(test_suites_.begin() + last_death_test_suite_,
                        new_test_suite);
  } else {
    // No.  Appends to the end of the list.
    test_suites_.push_back(new_test_suite);
  }

  test_suite_indices_.push_back(static_cast<int>(test_suite_indices_.size()));
  return new_test_suite;
}